

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O1

void __thiscall
CommandDrawNumber::Parse(CommandDrawNumber *this,FScanner *sc,bool fullScreenOffsets)

{
  char cVar1;
  SBarInfo *pSVar2;
  bool bVar3;
  bool bVar4;
  EColorRange EVar5;
  uint uVar6;
  FFont *pFVar7;
  ClassReg *pCVar8;
  PClassActor *pPVar9;
  FBaseCVar *pFVar10;
  int *piVar11;
  int *piVar12;
  char *message;
  FString *tail;
  FString local_40;
  FString *local_38;
  
  FScanner::MustGetToken(sc,0x104);
  this->length = sc->Number;
  FScanner::MustGetToken(sc,0x2c);
  bVar3 = FScanner::CheckToken(sc,0x102);
  if (!bVar3) {
    FScanner::MustGetToken(sc,0x101);
  }
  pFVar7 = V_GetFont(sc->String);
  (this->super_CommandDrawString).font = pFVar7;
  if (pFVar7 == (FFont *)0x0) {
    FScanner::ScriptMessage(sc,"Unknown font \'%s\'.",sc->String);
    (this->super_CommandDrawString).font = SmallFont;
  }
  FScanner::MustGetToken(sc,0x2c);
  EVar5 = SBarInfoCommand::GetTranslation((SBarInfoCommand *)this,sc);
  this->normalTranslation = EVar5;
  FScanner::MustGetToken(sc,0x2c);
  bVar3 = FScanner::CheckToken(sc,0x104);
  if (bVar3) {
    this->value = CONSTANT;
    (this->super_CommandDrawString).valueArgument = sc->Number;
  }
  else {
    bVar3 = FScanner::CheckToken(sc,0x102);
    if (!bVar3) {
      FScanner::MustGetToken(sc,0x101);
    }
    this->value = INVENTORY;
    if (sc->TokenType == 0x101) {
      bVar3 = FScanner::Compare(sc,"health");
      if (bVar3) {
        this->value = HEALTH;
      }
      else {
        bVar3 = FScanner::Compare(sc,"armor");
        if (bVar3) {
          this->value = ARMOR;
        }
        else {
          bVar3 = FScanner::Compare(sc,"ammo1");
          if (bVar3) {
            this->value = AMMO1;
          }
          else {
            bVar3 = FScanner::Compare(sc,"ammo2");
            if (bVar3) {
              this->value = AMMO2;
            }
            else {
              bVar3 = FScanner::Compare(sc,"ammo1capacity");
              if (bVar3) {
                this->value = AMMO1CAPACITY;
              }
              else {
                bVar3 = FScanner::Compare(sc,"ammo2capacity");
                if (bVar3) {
                  this->value = AMMO2CAPACITY;
                }
                else {
                  bVar3 = FScanner::Compare(sc,"score");
                  if (bVar3) {
                    this->value = SCORE;
                  }
                  else {
                    bVar3 = FScanner::Compare(sc,"ammo");
                    if (bVar3) {
                      bVar3 = FScanner::CheckToken(sc,0x28);
                      this->value = AMMO;
                      if ((!bVar3) || (bVar4 = FScanner::CheckToken(sc,0x102), !bVar4)) {
                        FScanner::MustGetToken(sc,0x101);
                      }
                      pPVar9 = PClass::FindActor(sc->String);
                      this->inventoryItem = pPVar9;
                      if (pPVar9 != (PClassActor *)0x0) {
                        if (pPVar9 != (PClassActor *)AAmmo::RegistrationInfo.MyClass) {
                          do {
                            pPVar9 = (PClassActor *)(pPVar9->super_PClass).ParentClass;
                            if (pPVar9 == (PClassActor *)AAmmo::RegistrationInfo.MyClass) break;
                          } while (pPVar9 != (PClassActor *)0x0);
LAB_004c6442:
                          if (pPVar9 == (PClassActor *)0x0) goto LAB_004c6447;
                        }
                        goto LAB_004c646c;
                      }
LAB_004c6447:
                      FScanner::ScriptMessage(sc,"\'%s\' is not a type of ammo.",sc->String);
                      pCVar8 = &AAmmo::RegistrationInfo;
LAB_004c6462:
                      this->inventoryItem = (PClassActor *)pCVar8->MyClass;
                    }
                    else {
                      bVar3 = FScanner::Compare(sc,"ammocapacity");
                      if (bVar3) {
                        bVar3 = FScanner::CheckToken(sc,0x28);
                        this->value = AMMOCAPACITY;
                        if ((!bVar3) || (bVar4 = FScanner::CheckToken(sc,0x102), !bVar4)) {
                          FScanner::MustGetToken(sc,0x101);
                        }
                        pPVar9 = PClass::FindActor(sc->String);
                        this->inventoryItem = pPVar9;
                        if (pPVar9 != (PClassActor *)0x0) {
                          if (pPVar9 != (PClassActor *)AAmmo::RegistrationInfo.MyClass) {
                            do {
                              pPVar9 = (PClassActor *)(pPVar9->super_PClass).ParentClass;
                              if (pPVar9 == (PClassActor *)AAmmo::RegistrationInfo.MyClass) break;
                            } while (pPVar9 != (PClassActor *)0x0);
                            goto LAB_004c6442;
                          }
                          goto LAB_004c646c;
                        }
                        goto LAB_004c6447;
                      }
                      bVar3 = FScanner::Compare(sc,"frags");
                      if (bVar3) {
                        this->value = FRAGS;
                        goto LAB_004c6634;
                      }
                      bVar3 = FScanner::Compare(sc,"kills");
                      if (bVar3) {
                        this->value = KILLS;
                        goto LAB_004c6634;
                      }
                      bVar3 = FScanner::Compare(sc,"monsters");
                      if (bVar3) {
                        this->value = MONSTERS;
                        goto LAB_004c6634;
                      }
                      bVar3 = FScanner::Compare(sc,"items");
                      if (bVar3) {
                        this->value = ITEMS;
                        goto LAB_004c6634;
                      }
                      bVar3 = FScanner::Compare(sc,"totalitems");
                      if (bVar3) {
                        this->value = TOTALITEMS;
                        goto LAB_004c6634;
                      }
                      bVar3 = FScanner::Compare(sc,"secrets");
                      if (bVar3) {
                        this->value = SECRETS;
                        goto LAB_004c6634;
                      }
                      bVar3 = FScanner::Compare(sc,"totalsecrets");
                      if (bVar3) {
                        this->value = TOTALSECRETS;
                        goto LAB_004c6634;
                      }
                      bVar3 = FScanner::Compare(sc,"armorclass");
                      if (bVar3) {
                        this->value = ARMORCLASS;
                        goto LAB_004c6634;
                      }
                      bVar3 = FScanner::Compare(sc,"savepercent");
                      if (bVar3) {
                        this->value = SAVEPERCENT;
                        goto LAB_004c6634;
                      }
                      bVar3 = FScanner::Compare(sc,"airtime");
                      if (bVar3) {
                        this->value = AIRTIME;
                        goto LAB_004c6634;
                      }
                      bVar3 = FScanner::Compare(sc,"accuracy");
                      if (bVar3) {
                        this->value = ACCURACY;
                        goto LAB_004c6634;
                      }
                      bVar3 = FScanner::Compare(sc,"stamina");
                      if (bVar3) {
                        this->value = STAMINA;
                        goto LAB_004c6634;
                      }
                      bVar3 = FScanner::Compare(sc,"keys");
                      if (bVar3) {
                        this->value = KEYS;
                        goto LAB_004c6634;
                      }
                      bVar3 = FScanner::Compare(sc,"globalvar");
                      if (!bVar3) {
                        bVar3 = FScanner::Compare(sc,"globalarray");
                        if (bVar3) {
                          bVar3 = FScanner::CheckToken(sc,0x28);
                          this->value = GLOBALARRAY;
                          goto LAB_004c6aeb;
                        }
                        bVar3 = FScanner::Compare(sc,"poweruptime");
                        if (!bVar3) {
                          bVar3 = FScanner::Compare(sc,"intcvar");
                          if (!bVar3) goto LAB_004c6634;
                          bVar3 = FScanner::CheckToken(sc,0x28);
                          this->value = INTCVAR;
                          if ((!bVar3) || (bVar4 = FScanner::CheckToken(sc,0x102), !bVar4)) {
                            FScanner::MustGetToken(sc,0x101);
                          }
                          FString::operator=(&this->cvarName,sc->String);
                          pFVar10 = FindCVar((this->cvarName).Chars,(FBaseCVar **)0x0);
                          if (pFVar10 == (FBaseCVar *)0x0) {
                            message = "CVar \'%s\' does not exist";
                          }
                          else {
                            uVar6 = (*pFVar10->_vptr_FBaseCVar[2])(pFVar10);
                            if (uVar6 < 2) goto LAB_004c646c;
                            message = "CVar \'%s\' is not an int or bool";
                          }
                          FScanner::ScriptMessage(sc,message,(this->cvarName).Chars);
                          goto LAB_004c646c;
                        }
                        bVar3 = FScanner::CheckToken(sc,0x28);
                        this->value = POWERUPTIME;
                        if ((!bVar3) || (bVar4 = FScanner::CheckToken(sc,0x102), !bVar4)) {
                          FScanner::MustGetToken(sc,0x101);
                        }
                        pPVar9 = PClass::FindActor(sc->String);
                        this->inventoryItem = pPVar9;
                        if (pPVar9 != (PClassActor *)0x0) {
                          if (pPVar9 != (PClassActor *)APowerupGiver::RegistrationInfo.MyClass) {
                            do {
                              pPVar9 = (PClassActor *)(pPVar9->super_PClass).ParentClass;
                              if (pPVar9 == (PClassActor *)APowerupGiver::RegistrationInfo.MyClass)
                              break;
                            } while (pPVar9 != (PClassActor *)0x0);
                            if (pPVar9 == (PClassActor *)0x0) goto LAB_004c6bb1;
                          }
                          goto LAB_004c646c;
                        }
LAB_004c6bb1:
                        FScanner::ScriptMessage
                                  (sc,"\'%s\' is not a type of PowerupGiver.",sc->String);
                        pCVar8 = &APowerupGiver::RegistrationInfo;
                        goto LAB_004c6462;
                      }
                      bVar3 = FScanner::CheckToken(sc,0x28);
                      this->value = GLOBALVAR;
LAB_004c6aeb:
                      FScanner::MustGetToken(sc,0x104);
                      if (0x3f < (uint)sc->Number) {
                        FScanner::ScriptError(sc,"Global variable number out of range: %d");
                      }
                      (this->super_CommandDrawString).valueArgument = sc->Number;
                    }
LAB_004c646c:
                    if (bVar3 != false) {
                      FScanner::MustGetToken(sc,0x29);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_004c6634:
    if (this->value == INVENTORY) {
      pPVar9 = PClass::FindActor(sc->String);
      this->inventoryItem = pPVar9;
      if (pPVar9 == (PClassActor *)0x0) {
LAB_004c6676:
        FScanner::ScriptMessage(sc,"\'%s\' is not a type of inventory item.",sc->String);
        this->inventoryItem = (PClassActor *)AInventory::RegistrationInfo.MyClass;
      }
      else if (pPVar9 != (PClassActor *)AInventory::RegistrationInfo.MyClass) {
        do {
          pPVar9 = (PClassActor *)(pPVar9->super_PClass).ParentClass;
          if (pPVar9 == (PClassActor *)AInventory::RegistrationInfo.MyClass) break;
        } while (pPVar9 != (PClassActor *)0x0);
        if (pPVar9 == (PClassActor *)0x0) goto LAB_004c6676;
      }
    }
  }
  FScanner::MustGetToken(sc,0x2c);
  bVar3 = FScanner::CheckToken(sc,0x101);
  if (bVar3) {
    tail = &(this->super_CommandDrawString).str;
    do {
      bVar3 = FScanner::Compare(sc,"fillzeros");
      if (bVar3) {
        (this->super_CommandDrawString).field_0x5c = 1;
      }
      else {
        bVar3 = FScanner::Compare(sc,"whennotzero");
        if (bVar3) {
          (this->super_CommandDrawString).field_0x5d = 1;
        }
        else {
          bVar3 = FScanner::Compare(sc,"dontcap");
          if (bVar3) {
            (this->super_CommandDrawString).field_0x5e = 1;
          }
          else {
            bVar3 = FScanner::Compare(sc,"drawshadow");
            if (bVar3) {
              bVar3 = FScanner::CheckToken(sc,0x28);
              if (bVar3) {
                FScanner::MustGetToken(sc,0x104);
                (this->super_CommandDrawString).shadowX = sc->Number;
                FScanner::MustGetToken(sc,0x2c);
                FScanner::MustGetToken(sc,0x104);
                (this->super_CommandDrawString).shadowY = sc->Number;
                FScanner::MustGetToken(sc,0x29);
              }
              (this->super_CommandDrawString).shadow = true;
            }
            else {
              bVar3 = FScanner::Compare(sc,"interpolate");
              if (bVar3) {
                FScanner::MustGetToken(sc,0x28);
                FScanner::MustGetToken(sc,0x104);
                this->interpolationSpeed = sc->Number;
              }
              else {
                bVar3 = FScanner::Compare(sc,"alignment");
                if (bVar3) {
                  FScanner::MustGetToken(sc,0x28);
                  FScanner::MustGetToken(sc,0x101);
                  bVar3 = FScanner::Compare(sc,"right");
                  if (bVar3) {
                    (this->super_CommandDrawString).alignment = ALIGN_RIGHT;
                  }
                  else {
                    bVar3 = FScanner::Compare(sc,"left");
                    if (bVar3) {
                      (this->super_CommandDrawString).alignment = ALIGN_LEFT;
                    }
                    else {
                      bVar3 = FScanner::Compare(sc,"center");
                      if (bVar3) {
                        (this->super_CommandDrawString).alignment = ALIGN_CENTER;
                      }
                      else {
                        FScanner::ScriptError(sc,"Unknown alignment \'%s\'.",sc->String);
                      }
                    }
                  }
                }
                else {
                  bVar3 = FScanner::Compare(sc,"prefix");
                  if (!bVar3) {
                    FScanner::ScriptError(sc,"Unknown flag \'%s\'.",sc->String);
                    goto LAB_004c67d4;
                  }
                  (this->super_CommandDrawString).field_0x5f = 1;
                  FScanner::MustGetToken(sc,0x28);
                  CommandDrawString::ParseStringValue(&this->super_CommandDrawString,sc);
                  FScanner::MustGetToken(sc,0x2c);
                  FScanner::MustGetToken(sc,0x102);
                  FString::operator=(&this->prefixPadding,sc->String);
                  if ((this->super_CommandDrawString).strValue == CONSTANT) {
                    (this->super_CommandDrawString).field_0x5f = 0;
                    local_38 = tail;
                    FString::operator+(&local_40,tail);
                    FString::operator=(&this->prefixPadding,&local_40);
                    FString::~FString(&local_40);
                    tail = local_38;
                  }
                }
              }
              FScanner::MustGetToken(sc,0x29);
            }
          }
        }
      }
LAB_004c67d4:
      bVar3 = FScanner::CheckToken(sc,0x7c);
      if (!bVar3) {
        FScanner::MustGetToken(sc,0x2c);
      }
      bVar3 = FScanner::CheckToken(sc,0x101);
    } while (bVar3);
  }
  SBarInfoCommand::GetCoordinates
            ((SBarInfoCommand *)this,sc,fullScreenOffsets,&(this->super_CommandDrawString).startX,
             &(this->super_CommandDrawString).y);
  bVar3 = FScanner::CheckToken(sc,0x2c);
  if (bVar3) {
    bVar3 = FScanner::CheckToken(sc,0x104);
    if (bVar3) {
      (this->super_CommandDrawString).spacing = sc->Number;
      bVar3 = FScanner::CheckToken(sc,0x2c);
      if (!bVar3) goto LAB_004c6a2f;
    }
    EVar5 = SBarInfoCommand::GetTranslation((SBarInfoCommand *)this,sc);
    this->lowTranslation = EVar5;
    FScanner::MustGetToken(sc,0x2c);
    FScanner::MustGetToken(sc,0x104);
    this->lowValue = sc->Number;
    bVar3 = FScanner::CheckToken(sc,0x2c);
    if (bVar3) {
      EVar5 = SBarInfoCommand::GetTranslation((SBarInfoCommand *)this,sc);
      this->highTranslation = EVar5;
      FScanner::MustGetToken(sc,0x2c);
      FScanner::MustGetToken(sc,0x104);
      this->highValue = sc->Number;
    }
  }
LAB_004c6a2f:
  FScanner::MustGetToken(sc,0x3b);
  if (this->value == ARMOR) {
    pSVar2 = (this->super_CommandDrawString).super_SBarInfoCommand.script;
    piVar11 = &pSVar2->armorInterpolationSpeed;
    cVar1 = pSVar2->interpolateArmor;
  }
  else {
    if (this->value != HEALTH) {
      return;
    }
    pSVar2 = (this->super_CommandDrawString).super_SBarInfoCommand.script;
    piVar11 = &pSVar2->interpolationSpeed;
    cVar1 = pSVar2->interpolateHealth;
  }
  piVar12 = &this->interpolationSpeed;
  if (cVar1 != '\0') {
    piVar12 = piVar11;
  }
  this->interpolationSpeed = *piVar12;
  return;
}

Assistant:

void	Parse(FScanner &sc, bool fullScreenOffsets)
		{
			sc.MustGetToken(TK_IntConst);
			length = sc.Number;
			sc.MustGetToken(',');
			if(!sc.CheckToken(TK_StringConst))
				sc.MustGetToken(TK_Identifier);
			font = V_GetFont(sc.String);
			if(font == NULL)
			{
				sc.ScriptMessage("Unknown font '%s'.", sc.String);
				font = SmallFont;
			}
			sc.MustGetToken(',');
			normalTranslation = GetTranslation(sc);
			sc.MustGetToken(',');
			if(sc.CheckToken(TK_IntConst))
			{
				value = CONSTANT;
				valueArgument = sc.Number;
				sc.MustGetToken(',');
			}
			else
			{
				if(!sc.CheckToken(TK_StringConst))
					sc.MustGetToken(TK_Identifier);
				value = INVENTORY;
				if(sc.TokenType == TK_Identifier)
				{
					if(sc.Compare("health"))
						value = HEALTH;
					else if(sc.Compare("armor"))
						value = ARMOR;
					else if(sc.Compare("ammo1"))
						value = AMMO1;
					else if(sc.Compare("ammo2"))
						value = AMMO2;
					else if(sc.Compare("ammo1capacity"))
						value = AMMO1CAPACITY;
					else if(sc.Compare("ammo2capacity"))
						value = AMMO2CAPACITY;
					else if(sc.Compare("score"))
						value = SCORE;
					else if(sc.Compare("ammo")) //request the next string to be an ammo type
					{
						bool parenthesized = sc.CheckToken('(');

						value = AMMO;
						if(!parenthesized || !sc.CheckToken(TK_StringConst))
							sc.MustGetToken(TK_Identifier);
						inventoryItem = PClass::FindActor(sc.String);
						if(inventoryItem == NULL || !RUNTIME_CLASS(AAmmo)->IsAncestorOf(inventoryItem)) //must be a kind of ammo
						{
							sc.ScriptMessage("'%s' is not a type of ammo.", sc.String);
							inventoryItem = RUNTIME_CLASS(AAmmo);
						}

						if(parenthesized) sc.MustGetToken(')');
					}
					else if(sc.Compare("ammocapacity"))
					{
						bool parenthesized = sc.CheckToken('(');

						value = AMMOCAPACITY;
						if(!parenthesized || !sc.CheckToken(TK_StringConst))
							sc.MustGetToken(TK_Identifier);
						inventoryItem = PClass::FindActor(sc.String);
						if(inventoryItem == NULL || !RUNTIME_CLASS(AAmmo)->IsAncestorOf(inventoryItem)) //must be a kind of ammo
						{
							sc.ScriptMessage("'%s' is not a type of ammo.", sc.String);
							inventoryItem = RUNTIME_CLASS(AAmmo);
						}

						if(parenthesized) sc.MustGetToken(')');
					}
					else if(sc.Compare("frags"))
						value = FRAGS;
					else if(sc.Compare("kills"))
						value = KILLS;
					else if(sc.Compare("monsters"))
						value = MONSTERS;
					else if(sc.Compare("items"))
						value = ITEMS;
					else if(sc.Compare("totalitems"))
						value = TOTALITEMS;
					else if(sc.Compare("secrets"))
						value = SECRETS;
					else if(sc.Compare("totalsecrets"))
						value = TOTALSECRETS;
					else if(sc.Compare("armorclass"))
						value = ARMORCLASS;
					else if(sc.Compare("savepercent"))
						value = SAVEPERCENT;
					else if(sc.Compare("airtime"))
						value = AIRTIME;
					else if(sc.Compare("accuracy"))
						value = ACCURACY;
					else if(sc.Compare("stamina"))
						value = STAMINA;
					else if(sc.Compare("keys"))
						value = KEYS;
					else if(sc.Compare("globalvar"))
					{
						bool parenthesized = sc.CheckToken('(');

						value = GLOBALVAR;
						sc.MustGetToken(TK_IntConst);
						if(sc.Number < 0 || sc.Number >= NUM_GLOBALVARS)
							sc.ScriptError("Global variable number out of range: %d", sc.Number);
						valueArgument = sc.Number;

						if(parenthesized) sc.MustGetToken(')');
					}
					else if(sc.Compare("globalarray")) //acts like variable[playernumber()]
					{
						bool parenthesized = sc.CheckToken('(');

						value = GLOBALARRAY;
						sc.MustGetToken(TK_IntConst);
						if(sc.Number < 0 || sc.Number >= NUM_GLOBALVARS)
							sc.ScriptError("Global variable number out of range: %d", sc.Number);
						valueArgument = sc.Number;

						if(parenthesized) sc.MustGetToken(')');
					}
					else if(sc.Compare("poweruptime"))
					{
						bool parenthesized = sc.CheckToken('(');

						value = POWERUPTIME;
						if(!parenthesized || !sc.CheckToken(TK_StringConst))
							sc.MustGetToken(TK_Identifier);
						inventoryItem = PClass::FindActor(sc.String);
						if(inventoryItem == NULL || !RUNTIME_CLASS(APowerupGiver)->IsAncestorOf(inventoryItem))
						{
							sc.ScriptMessage("'%s' is not a type of PowerupGiver.", sc.String);
							inventoryItem = RUNTIME_CLASS(APowerupGiver);
						}

						if(parenthesized) sc.MustGetToken(')');
					}
					else if (sc.Compare("intcvar"))
					{
						bool parenthesized = sc.CheckToken('(');

						value = INTCVAR;

						if (!parenthesized || !sc.CheckToken(TK_StringConst))
							sc.MustGetToken(TK_Identifier);
						
						cvarName = sc.String;

						// We have a name, but make sure it exists. If not, send notification so modders
						// are aware of the situation.
						FBaseCVar *CVar = FindCVar(cvarName, nullptr);

						if (CVar != nullptr)
						{
							ECVarType cvartype = CVar->GetRealType();

							if (!(cvartype == CVAR_Bool || cvartype == CVAR_Int))
							{
								sc.ScriptMessage("CVar '%s' is not an int or bool", cvarName.GetChars());
							}
						}
						else
						{
							sc.ScriptMessage("CVar '%s' does not exist", cvarName.GetChars());
						}
						
						if (parenthesized) sc.MustGetToken(')');
					}
				}
				if(value == INVENTORY)
				{
					inventoryItem = PClass::FindActor(sc.String);
					if(inventoryItem == NULL || !RUNTIME_CLASS(AInventory)->IsAncestorOf(inventoryItem)) //must be a kind of ammo
					{
						sc.ScriptMessage("'%s' is not a type of inventory item.", sc.String);
						inventoryItem = RUNTIME_CLASS(AInventory);
					}
				}
				sc.MustGetToken(',');
			}
			while(sc.CheckToken(TK_Identifier))
			{
				if(sc.Compare("fillzeros"))
					fillZeros = true;
				else if(sc.Compare("whennotzero"))
					whenNotZero = true;
				else if(sc.Compare("dontcap"))
					dontCap = true;
				else if(sc.Compare("drawshadow"))
				{
					if(sc.CheckToken('('))
					{
						sc.MustGetToken(TK_IntConst);
						shadowX = sc.Number;
						sc.MustGetToken(',');
						sc.MustGetToken(TK_IntConst);
						shadowY = sc.Number;
						sc.MustGetToken(')');
					}
					shadow = true;
				}
				else if(sc.Compare("interpolate"))
				{
					sc.MustGetToken('(');
					sc.MustGetToken(TK_IntConst);
					interpolationSpeed = sc.Number;
					sc.MustGetToken(')');
				}
				else if(sc.Compare("alignment"))
				{
					sc.MustGetToken('(');
					sc.MustGetToken(TK_Identifier);
					if(sc.Compare("right"))
						alignment = ALIGN_RIGHT;
					else if(sc.Compare("left"))
						alignment = ALIGN_LEFT;
					else if(sc.Compare("center"))
						alignment = ALIGN_CENTER;
					else
						sc.ScriptError("Unknown alignment '%s'.", sc.String);
					sc.MustGetToken(')');
				}
				else if(sc.Compare("prefix"))
				{
					usePrefix = true;
					sc.MustGetToken('(');
					ParseStringValue(sc);
					sc.MustGetToken(',');
					sc.MustGetToken(TK_StringConst);
					prefixPadding = sc.String;
					if(strValue == CommandDrawString::CONSTANT)
					{
						usePrefix = false; // Use prefix just determines if we tick the string.
						prefixPadding = str + prefixPadding;
					}
					sc.MustGetToken(')');
				}
				else
					sc.ScriptError("Unknown flag '%s'.", sc.String);
				if(!sc.CheckToken('|'))
					sc.MustGetToken(',');
			}
			GetCoordinates(sc, fullScreenOffsets, startX, y);
			if(sc.CheckToken(','))
			{
				bool needsComma = false;
				if(sc.CheckToken(TK_IntConst)) //font spacing
				{
					spacing = sc.Number;
					needsComma = true;
				}
				if(!needsComma || sc.CheckToken(',')) //2nd coloring for "low-on" value
				{
					lowTranslation = GetTranslation(sc);
					sc.MustGetToken(',');
					sc.MustGetToken(TK_IntConst);
					lowValue = sc.Number;
					if(sc.CheckToken(',')) //3rd coloring for "high-on" value
					{
						highTranslation = GetTranslation(sc);
						sc.MustGetToken(',');
						sc.MustGetToken(TK_IntConst);
						highValue = sc.Number;
					}
				}
			}
			sc.MustGetToken(';');

			if(value == HEALTH)
				interpolationSpeed = script->interpolateHealth ? script->interpolationSpeed : interpolationSpeed;
			else if(value == ARMOR)
				interpolationSpeed = script->interpolateArmor ? script->armorInterpolationSpeed : interpolationSpeed;
		}